

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall nigel::Lexer::printLexerStructure(Lexer *this,CodeBase *base)

{
  bool bVar1;
  size_type __val;
  list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_> *this_00;
  reference psVar2;
  element_type *peVar3;
  double __x;
  double __x_00;
  double __x_01;
  allocator local_f1;
  string local_f0 [32];
  helper local_d0 [32];
  undefined1 local_b0 [8];
  shared_ptr<nigel::Token> l;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_> *__range1;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  CodeBase *local_18;
  CodeBase *base_local;
  Lexer *this_local;
  
  local_18 = base;
  base_local = (CodeBase *)this;
  __val = std::__cxx11::
          list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>::size
                    (&base->lexerStruct);
  std::__cxx11::to_string(&local_78,__val);
  std::operator+(&local_58,"Lexer structure (",&local_78);
  std::operator+(&local_38,&local_58," items): ");
  helper::log((helper *)&local_38,__x);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  this_00 = &local_18->lexerStruct;
  __end1 = std::__cxx11::
           list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>::
           begin(this_00);
  l.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::__cxx11::
       list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>::end
                 (this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&l.
                                              super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount);
    if (!bVar1) break;
    psVar2 = std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator*(&__end1);
    std::shared_ptr<nigel::Token>::shared_ptr((shared_ptr<nigel::Token> *)local_b0,psVar2);
    peVar3 = std::__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nigel::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_b0);
    (*peVar3->_vptr_Token[2])(local_d0,peVar3,1);
    helper::log(local_d0,__x_00);
    std::__cxx11::string::~string((string *)local_d0);
    std::shared_ptr<nigel::Token>::~shared_ptr((shared_ptr<nigel::Token> *)local_b0);
    std::_List_iterator<std::shared_ptr<nigel::Token>_>::operator++(&__end1);
  }
  std::allocator<char>::allocator();
  __x_01 = (double)std::__cxx11::string::string(local_f0,"Lexer end",&local_f1);
  helper::log((helper *)local_f0,__x_01);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  return;
}

Assistant:

void Lexer::printLexerStructure( CodeBase & base )
	{
		log( "Lexer structure (" + to_string( base.lexerStruct.size() ) + " items): " );
		for( auto l : base.lexerStruct )
		{
			log( l->toString( true ) );
		}
		log( "Lexer end" );
	}